

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_index_list.cpp
# Opt level: O2

void __thiscall duckdb::TableIndexList::CommitDrop(TableIndexList *this,string *name)

{
  pointer puVar1;
  __type _Var2;
  int iVar3;
  pointer pIVar4;
  undefined4 extraout_var;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  pointer this_00;
  
  ::std::mutex::lock(&this->indexes_lock);
  puVar1 = (this->indexes).
           super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->indexes).
                 super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    pIVar4 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                       (this_00);
    iVar3 = (*pIVar4->_vptr_Index[4])(pIVar4);
    _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(extraout_var,iVar3),name);
    if (_Var2) {
      pIVar4 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                         (this_00);
      (*pIVar4->_vptr_Index[6])(pIVar4);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void TableIndexList::CommitDrop(const string &name) {
	lock_guard<mutex> lock(indexes_lock);

	for (auto &index : indexes) {
		if (index->GetIndexName() == name) {
			index->CommitDrop();
		}
	}
}